

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O2

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  long offset;
  bool bVar1;
  int iVar2;
  uint uVar3;
  mode_t mVar4;
  wchar_t wVar5;
  char *pcVar6;
  la_int64_t lVar7;
  char *pcVar8;
  __off_t _Var10;
  __off_t __offset;
  __off_t _Var11;
  ulong uVar12;
  int *piVar13;
  uint uVar14;
  ulong uVar15;
  size_t __size;
  long lVar16;
  int iVar17;
  uint *puVar18;
  int local_10e0;
  int local_10dc;
  __off_t local_10d8;
  ulong local_10d0;
  stat s;
  int stflags;
  undefined8 local_1030;
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  uint local_ff0 [1008];
  ssize_t sVar9;
  
  local_10e0 = fd;
  archive_clear_error(_a);
  pcVar6 = archive_entry_sourcepath(entry);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = archive_entry_pathname(entry);
  }
  if (*(long *)&_a[1].archive_format == 0) {
    if (st == (stat *)0x0) {
      if (fd < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          st = &s;
          iVar2 = lstat(pcVar6,(stat *)st);
          if (iVar2 != 0) {
            piVar13 = __errno_location();
            iVar2 = *piVar13;
            pcVar8 = "Can\'t lstat %s";
            goto LAB_0033db09;
          }
        }
        else {
          st = &s;
          iVar2 = stat(pcVar6,(stat *)st);
          if (iVar2 != 0) {
            piVar13 = __errno_location();
            iVar2 = *piVar13;
            pcVar8 = "Can\'t stat %s";
LAB_0033db09:
            archive_set_error(_a,iVar2,pcVar8,pcVar6);
            return -0x19;
          }
        }
      }
      else {
        st = &s;
        iVar2 = fstat(fd,(stat *)st);
        if (iVar2 != 0) {
          piVar13 = __errno_location();
          iVar2 = *piVar13;
          pcVar6 = "Can\'t fstat";
          goto LAB_0033d7df;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  lVar7 = archive_entry_uid(entry);
  pcVar8 = archive_read_disk_uname(_a,lVar7);
  if (pcVar8 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar8);
  }
  lVar7 = archive_entry_gid(entry);
  pcVar8 = archive_read_disk_gname(_a,lVar7);
  if (pcVar8 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar8);
  }
  if (((_a[1].file_count & 0x40) == 0) && ((st->st_mode & 0xf000) == 0x4000)) {
    if (local_10e0 < 0) {
      if (*(long *)&_a[1].archive_format == 0) {
        local_10e0 = open(pcVar6,0x80800);
      }
      else {
        local_10e0 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar6,0x80800);
      }
      __archive_ensure_cloexec_flag(local_10e0);
      if (local_10e0 < 0) goto LAB_0033d785;
    }
    iVar2 = ioctl(local_10e0,0x80086601,&stflags);
    if (stflags != 0 && iVar2 == 0) {
      archive_entry_set_fflags(entry,(long)stflags,0);
    }
  }
LAB_0033d785:
  if ((st->st_mode & 0xf000) == 0xa000) {
    __size = st->st_size + 1;
    pcVar8 = (char *)malloc(__size);
    if (pcVar8 == (char *)0x0) {
      pcVar6 = "Couldn\'t read link data";
      iVar2 = 0xc;
LAB_0033d7df:
      archive_set_error(_a,iVar2,pcVar6);
      return -0x19;
    }
    if (*(long *)&_a[1].archive_format == 0) {
      sVar9 = readlink(pcVar6,pcVar8,__size);
      uVar3 = (uint)sVar9;
    }
    else {
      iVar2 = (**(code **)&_a[1].compression_code)();
      sVar9 = readlinkat(iVar2,pcVar6,pcVar8,__size);
      uVar3 = (uint)sVar9;
    }
    if ((int)uVar3 < 0) {
      piVar13 = __errno_location();
      archive_set_error(_a,*piVar13,"Couldn\'t read link data");
      free(pcVar8);
      return -0x19;
    }
    pcVar8[uVar3 & 0x7fffffff] = '\0';
    archive_entry_set_symlink(entry,pcVar8);
    free(pcVar8);
  }
  mVar4 = archive_entry_filetype(entry);
  iVar2 = 0;
  if (((mVar4 != 0x8000) || (lVar7 = archive_entry_size(entry), lVar7 < 1)) ||
     (pcVar6 = archive_entry_hardlink(entry), pcVar6 != (char *)0x0)) goto LAB_0033dc21;
  local_10dc = fd;
  if ((local_10e0 < 0) &&
     (pcVar6 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,&local_10e0),
     local_10e0 < 0)) {
    iVar2 = -0x19;
    fd = local_10dc;
    if (pcVar6 == (char *)0x0) goto LAB_0033dc21;
    local_10e0 = open(pcVar6,0x80800);
    if (-1 < local_10e0) {
      __archive_ensure_cloexec_flag(local_10e0);
      _Var11 = 0;
      goto LAB_0033d8a8;
    }
LAB_0033dca1:
    iVar2 = -0x19;
    piVar13 = __errno_location();
    archive_set_error(_a,*piVar13,"Can\'t open `%s\'",pcVar6);
    fd = local_10dc;
  }
  else {
    _Var10 = lseek(local_10e0,0,1);
    _Var11 = 0;
    if (_Var10 != 0) {
      lseek(local_10e0,0,0);
      _Var11 = _Var10;
    }
LAB_0033d8a8:
    iVar2 = 0;
    _Var10 = lseek(local_10e0,0,4);
    if (-1 < _Var10) {
      local_10d8 = _Var11;
      if (_Var10 != 0) {
        lseek(local_10e0,0,0);
      }
      lVar7 = archive_entry_size(entry);
      iVar2 = 0;
      _Var11 = 0;
      while (_Var10 = local_10d8, _Var11 < lVar7) {
        __offset = lseek(local_10e0,_Var11,3);
        if (__offset == -1) {
          piVar13 = __errno_location();
          _Var10 = local_10d8;
          iVar2 = *piVar13;
          if (iVar2 == 6) {
            wVar5 = archive_entry_sparse_count(entry);
            iVar2 = 0;
            if (wVar5 == L'\0') {
              iVar2 = 0;
              _Var11 = lseek(local_10e0,0,4);
              if (_Var11 == 0) {
                iVar2 = 0;
                _Var11 = lseek(local_10e0,0,2);
                if (_Var11 == lVar7) {
                  iVar2 = 0;
                  archive_entry_sparse_add_entry(entry,0,0);
                }
              }
            }
          }
          else {
            pcVar6 = "lseek(SEEK_HOLE) failed";
LAB_0033dbff:
            archive_set_error(_a,iVar2,pcVar6);
            iVar2 = -0x19;
          }
          break;
        }
        _Var11 = lseek(local_10e0,__offset,4);
        if (_Var11 == -1) {
          piVar13 = __errno_location();
          _Var10 = local_10d8;
          iVar2 = *piVar13;
          if (iVar2 == 6) {
            _Var11 = lseek(local_10e0,0,2);
            iVar2 = 0;
            if (_Var11 != -1) break;
            iVar2 = *piVar13;
          }
          pcVar6 = "lseek(SEEK_DATA) failed";
          goto LAB_0033dbff;
        }
        _Var10 = local_10d8;
        if (_Var11 == lVar7 && __offset == 0) break;
        archive_entry_sparse_add_entry(entry,__offset,_Var11 - __offset);
      }
      lseek(local_10e0,_Var10,0);
      fd = local_10dc;
      goto LAB_0033dc21;
    }
    mVar4 = archive_entry_filetype(entry);
    fd = local_10dc;
    if (((mVar4 != 0x8000) || (lVar7 = archive_entry_size(entry), fd = local_10dc, lVar7 < 1)) ||
       (pcVar6 = archive_entry_hardlink(entry), fd = local_10dc, pcVar6 != (char *)0x0))
    goto LAB_0033dc21;
    if (local_10e0 < 0) {
      pcVar6 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,(int *)0x0);
      iVar2 = -0x19;
      fd = local_10dc;
      if (pcVar6 == (char *)0x0) goto LAB_0033dc21;
      if (*(long *)&_a[1].archive_format == 0) {
        local_10e0 = open(pcVar6,0x80800);
      }
      else {
        local_10e0 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar6,0x80800);
      }
      if (local_10e0 < 0) goto LAB_0033dca1;
      __archive_ensure_cloexec_flag(local_10e0);
    }
    memset(&stflags,0,0x1000);
    local_1030 = 0xffffffffffffffff;
    local_1028 = 1;
    local_1020 = 0x48;
    uVar12 = archive_entry_size(entry);
    iVar17 = 0;
    local_10d0 = 0xc020660b;
    while (iVar2 = ioctl(local_10e0,local_10d0,&stflags), -1 < iVar2) {
      if (local_1024 == 0) {
        iVar2 = 0;
        fd = local_10dc;
        if (iVar17 == 0) {
          iVar2 = 0;
          archive_entry_sparse_add_entry(entry,0,0);
          fd = local_10dc;
        }
        goto LAB_0033dc21;
      }
      local_10d8 = CONCAT44(local_10d8._4_4_,iVar17);
      puVar18 = local_ff0;
      bVar1 = true;
      uVar3 = local_1024;
      for (iVar17 = 0; iVar17 < (int)uVar3; iVar17 = iVar17 + 1) {
        uVar14 = *puVar18;
        if ((uVar14 >> 0xb & 1) == 0) {
          offset = *(long *)(puVar18 + -10);
          uVar15 = offset + *(long *)(puVar18 + -6);
          iVar2 = 0;
          lVar16 = 0;
          if (uVar12 <= uVar15) {
            lVar16 = uVar15 - uVar12;
          }
          uVar15 = *(long *)(puVar18 + -6) - lVar16;
          fd = local_10dc;
          if (uVar15 == uVar12 && offset == 0) goto LAB_0033dc21;
          if (0 < (long)uVar15) {
            archive_entry_sparse_add_entry(entry,offset,uVar15);
            uVar14 = *puVar18;
            uVar3 = local_1024;
          }
        }
        if ((uVar14 & 1) != 0) {
          bVar1 = false;
        }
        puVar18 = puVar18 + 0xe;
      }
      if (!bVar1) break;
      _stflags = s.__glibc_reserved[(ulong)uVar3 * 7 + 2] + s.__glibc_reserved[(ulong)uVar3 * 7];
      iVar17 = (int)local_10d8 + 1;
    }
    iVar2 = 0;
    fd = local_10dc;
  }
LAB_0033dc21:
  if (local_10e0 != fd) {
    close(local_10e0);
  }
  return iVar2;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 && st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS)) || \
    (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS))
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 &&
	    (S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd,
#if defined(FS_IOC_GETFLAGS)
			    FS_IOC_GETFLAGS,
#else
			    EXT2_IOC_GETFLAGS,
#endif
			    &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size + 1;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = 0;
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = 0;
	if ((a->flags & ARCHIVE_READDISK_NO_ACL) == 0)
		r = archive_read_disk_entry_setup_acls(a, entry, &fd);
	if ((a->flags & ARCHIVE_READDISK_NO_XATTR) == 0) {
		r1 = setup_xattrs(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if (a->flags & ARCHIVE_READDISK_MAC_COPYFILE) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	r1 = setup_sparse(a, entry, &fd);
	if (r1 < r)
		r = r1;

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}